

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_sde.c
# Opt level: O0

err_t beltSDEEncr(void *dest,void *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  octet *iv_00;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  void *in_stack_ffffffffffffffb8;
  
  if ((((((in_RDX & 0xf) == 0) && (0x1f < in_RDX)) &&
       ((in_R8 == (void *)0x10 || ((in_R8 == (void *)0x18 || (in_R8 == (void *)0x20)))))) &&
      (bVar1 = memIsValid(in_RSI,in_RDX), bVar1 != 0)) &&
     (((bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0 &&
       (bVar1 = memIsValid(in_R9,0x10), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,in_RDX), bVar1 != 0)))) {
    beltSDE_keep();
    iv_00 = (octet *)blobCreate((size_t)in_stack_ffffffffffffffb8);
    if (iv_00 == (octet *)0x0) {
      return 0x6e;
    }
    beltSDEStart(in_R8,in_R9,(size_t)iv_00);
    memMove(iv_00,in_stack_ffffffffffffffb8,0x159c67);
    beltSDEStepE(in_R8,(size_t)in_R9,iv_00,in_stack_ffffffffffffffb8);
    blobClose((blob_t)0x159c8a);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltSDEEncr(void* dest, const void* src, size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count % 16 != 0 || count < 32 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltSDE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// зашифровать
	beltSDEStart(state, key, len);
	memMove(dest, src, count);
	beltSDEStepE(dest, count, iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}